

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_types.h
# Opt level: O2

char * Potassco::toString(Heuristic_t t)

{
  if (t.val_ < __eEnd) {
    return &DAT_001a44a8 + *(int *)(&DAT_001a44a8 + (ulong)t.val_ * 4);
  }
  return "";
}

Assistant:

inline const char* toString(Heuristic_t t) {
	switch (t) {
		case Heuristic_t::Level: return "level";
		case Heuristic_t::Sign:  return "sign";
		case Heuristic_t::Factor:return "factor";
		case Heuristic_t::Init:  return "init";
		case Heuristic_t::True:  return "true";
		case Heuristic_t::False: return "false";
		default: return "";
	}
}